

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

int check_terrain_mastery(CHAR_DATA *ch)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  bVar1 = is_npc(ch);
  iVar3 = 0;
  if (!bVar1) {
    iVar2 = get_skill(ch,(int)gsn_terrain_mastery);
    iVar3 = 0;
    if (0 < iVar2) {
      bVar1 = style_check((int)gsn_terrain_mastery,(int)ch->pcdata->style);
      if (bVar1) {
        lVar4 = 0;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + (int)ch->pcdata->sect_time[lVar4 + 1];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x14);
        if (iVar3 == 0) {
          iVar3 = 0;
        }
        else {
          lVar4 = ch->pcdata->sect_time[ch->in_room->sector_type];
          check_improve(ch,(int)gsn_terrain_mastery,true,4);
          iVar3 = (int)((((float)lVar4 / (float)iVar3) * 100.0) /
                       ((float)(int)ch->mod_stat[1] * -0.36 + 10.0));
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int check_terrain_mastery(CHAR_DATA *ch)
{
	int i, skill, total = 0;
	float sect_per = 0;

	if (is_npc(ch))
		return 0;

	skill = get_skill(ch, gsn_terrain_mastery);

	if (skill > 0)
	{
		if (!style_check(gsn_terrain_mastery, ch->pcdata->style))
			return 0;

		for (i = 1; i < SECT_MAX; i++)
		{
			total += ch->pcdata->sect_time[i];
		}

		if (total == 0)
			return 0;

		sect_per = (float)(ch->pcdata->sect_time[ch->in_room->sector_type]) / (float)total * 100;

		check_improve(ch, gsn_terrain_mastery, true, 4);
		return (int)(sect_per / (10 - 0.36 * (ch->mod_stat[STAT_INT])));
	}

	return 0;
}